

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

intmax_t config_find_number_fallback(map *config_map,char *key,intmax_t fallback)

{
  natwm_error nVar1;
  intmax_t local_28;
  intmax_t value;
  
  local_28 = 0;
  nVar1 = config_find_number(config_map,key,&local_28);
  if (nVar1 == NO_ERROR) {
    fallback = local_28;
  }
  return fallback;
}

Assistant:

intmax_t config_find_number_fallback(const struct map *config_map, const char *key,
                                     intmax_t fallback)
{
        intmax_t value = 0;

        if (config_find_number(config_map, key, &value) != NO_ERROR) {
                return fallback;
        }

        return value;
}